

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O2

void fstk_RunMacro(char *macroName,MacroArgs *args)

{
  uint32_t uVar1;
  Symbol *__s;
  MacroArgs *pMVar2;
  size_t __n;
  size_t sVar3;
  FileStackNode *pFVar4;
  LexerState *pLVar5;
  int *piVar6;
  char *pcVar7;
  long lVar8;
  FileStackNode *pFVar9;
  
  __s = sym_FindExactSymbol(macroName);
  if (__s == (Symbol *)0x0) {
    pcVar7 = "Macro \"%s\" not defined\n";
  }
  else {
    if (__s->type == SYM_MACRO) {
      pMVar2 = macro_GetCurrentArgs();
      contextStack->macroArgs = pMVar2;
      pFVar9 = __s->src;
      if (pFVar9->type == NODE_REPT) {
        pFVar4 = pFVar9 + 1;
        do {
          pFVar9 = pFVar9->parent;
        } while (pFVar9->type == NODE_REPT);
        lVar8 = (ulong)*(uint *)&pFVar4->parent * 0x11 + 0x2b;
      }
      else {
        lVar8 = 0x2b;
      }
      __n = strlen((char *)(pFVar9 + 1));
      sVar3 = strlen(__s->name);
      pFVar4 = (FileStackNode *)malloc(lVar8 + sVar3 + __n);
      if (pFVar4 != (FileStackNode *)0x0) {
        pFVar4->type = NODE_MACRO;
        memcpy(pFVar4 + 1,pFVar9 + 1,__n);
        *(undefined2 *)((long)&pFVar4[1].parent + __n) = 0x3a3a;
        memcpy((void *)((long)&pFVar4[1].parent + __n + 2),__s,sVar3 + 1);
        newContext(pFVar4);
        pLVar5 = lexer_OpenFileView("MACRO",(__s->field_8).field_2.macro,
                                    (__s->field_8).field_2.macroSize,__s->fileLine);
        contextStack->lexerState = pLVar5;
        if (pLVar5 != (LexerState *)0x0) {
          lexerStateEOL = pLVar5;
          uVar1 = macro_UseNewUniqueID();
          contextStack->uniqueID = uVar1;
          macro_UseNewArgs(args);
          return;
        }
        fatalerror("Failed to set up lexer for macro invocation\n");
      }
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      error("Failed to alloc file info for \"%s\": %s\n",__s,pcVar7);
      return;
    }
    pcVar7 = "\"%s\" is not a macro\n";
  }
  error(pcVar7,macroName);
  return;
}

Assistant:

void fstk_RunMacro(char const *macroName, struct MacroArgs *args)
{
	struct Symbol *macro = sym_FindExactSymbol(macroName);

	if (!macro) {
		error("Macro \"%s\" not defined\n", macroName);
		return;
	}
	if (macro->type != SYM_MACRO) {
		error("\"%s\" is not a macro\n", macroName);
		return;
	}
	contextStack->macroArgs = macro_GetCurrentArgs();

	// Compute total length of this node's name: <base name>::<macro>
	size_t reptNameLen = 0;
	struct FileStackNode const *node = macro->src;

	if (node->type == NODE_REPT) {
		struct FileStackReptNode const *reptNode = (struct FileStackReptNode const *)node;

		// 4294967295 = 2^32 - 1, aka UINT32_MAX
		reptNameLen += reptNode->reptDepth * strlen("::REPT~4294967295");
		// Look for next named node
		do {
			node = node->parent;
		} while (node->type == NODE_REPT);
	}
	struct FileStackNamedNode const *baseNode = (struct FileStackNamedNode const *)node;
	size_t baseLen = strlen(baseNode->name);
	size_t macroNameLen = strlen(macro->name);
	struct FileStackNamedNode *fileInfo = (struct FileStackNamedNode *)malloc(sizeof(*fileInfo) +
			baseLen + reptNameLen + 2 + macroNameLen + 1);

	if (!fileInfo) {
		error("Failed to alloc file info for \"%s\": %s\n", macro->name, strerror(errno));
		return;
	}
	fileInfo->node.type = NODE_MACRO;
	// Print the name...
	char *dest = fileInfo->name;

	memcpy(dest, baseNode->name, baseLen);
	dest += baseLen;
	if (node->type == NODE_REPT) {
		struct FileStackReptNode const *reptNode = (struct FileStackReptNode const *)node;

		for (uint32_t i = reptNode->reptDepth; i--; ) {
			int nbChars = sprintf(dest, "::REPT~%" PRIu32, reptNode->iters[i]);

			if (nbChars < 0)
				fatalerror("Failed to write macro invocation info: %s\n",
					   strerror(errno));
			dest += nbChars;
		}
	}
	*dest++ = ':';
	*dest++ = ':';
	memcpy(dest, macro->name, macroNameLen + 1);

	newContext((struct FileStackNode *)fileInfo);
	contextStack->lexerState = lexer_OpenFileView("MACRO", macro->macro, macro->macroSize,
						      macro->fileLine);
	if (!contextStack->lexerState)
		fatalerror("Failed to set up lexer for macro invocation\n");
	lexer_SetStateAtEOL(contextStack->lexerState);
	contextStack->uniqueID = macro_UseNewUniqueID();
	macro_UseNewArgs(args);
}